

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowcontainer.cpp
# Opt level: O3

void __thiscall QWindowContainer::~QWindowContainer(QWindowContainer *this)

{
  long lVar1;
  long lVar2;
  
  *(undefined ***)this = &PTR_metaObject_007e8490;
  *(undefined ***)(this + 0x10) = &PTR__QWindowContainer_007e8640;
  lVar1 = *(long *)(this + 8);
  lVar2 = *(long *)(lVar1 + 600);
  if (lVar2 != 0) {
    if ((*(int *)(lVar2 + 4) != 0) && (*(QObject **)(lVar1 + 0x260) != (QObject *)0x0)) {
      QObject::removeEventFilter(*(QObject **)(lVar1 + 0x260));
      QWindow::destroy();
      lVar2 = *(long *)(lVar1 + 600);
      if (lVar2 == 0) goto LAB_00325712;
    }
    if ((*(int *)(lVar2 + 4) != 0) && (*(long **)(lVar1 + 0x260) != (long *)0x0)) {
      (**(code **)(**(long **)(lVar1 + 0x260) + 0x20))();
    }
  }
LAB_00325712:
  QWidget::~QWidget((QWidget *)this);
  return;
}

Assistant:

QWindowContainer::~QWindowContainer()
{
    Q_D(QWindowContainer);

    // Call destroy() explicitly first. The dtor would do this too, but
    // QEvent::PlatformSurface delivery relies on virtuals. Getting
    // SurfaceAboutToBeDestroyed can be essential for OpenGL, Vulkan, etc.
    // QWindow subclasses in particular. Keep these working.
    if (d->window) {
        d->window->removeEventFilter(this);
        d->window->destroy();
    }

    delete d->window;
}